

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

int Edg_ObjImprove(Gia_Man_t *p,int iObj,int nEdgeLimit,int DelayMax,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  int pFanouts [4];
  int pFanins [4];
  ulong local_88;
  uint local_80;
  uint local_7c;
  uint local_74;
  ulong local_70;
  uint auStack_58 [4];
  uint auStack_48 [6];
  
  if (iObj < 0) {
LAB_001fbc45:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar7 = (ulong)(uint)iObj;
  iVar10 = p->vEdgeDelayR->nSize;
  if (iVar10 <= iObj) goto LAB_001fbc45;
  if (p->vMapping2->nSize <= iObj) goto LAB_001fbcff;
  piVar3 = p->vEdgeDelayR->pArray;
  pVVar4 = p->vMapping2->pArray;
  uVar1 = pVVar4[uVar7].nSize;
  uVar17 = 0;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  local_74 = 0;
  local_80 = 0;
  local_88 = 0;
  if (0 < (long)(int)uVar1) {
    iVar13 = piVar3[uVar7];
    local_88 = 0;
    local_80 = 0;
    local_74 = 0;
    uVar17 = 0;
    uVar14 = 0;
    do {
      if ((long)(int)uVar1 <= (long)uVar14) goto LAB_001fbc45;
      uVar9 = pVVar4[uVar7].pArray[uVar14];
      lVar15 = (long)(int)uVar9;
      if ((lVar15 < 0) || (p->nObjs <= (int)uVar9)) goto LAB_001fbc64;
      if ((~*(uint *)(p->pObjs + lVar15) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(p->pObjs + lVar15)) {
        if ((p->vEdgeDelay->nSize <= (int)uVar9) || (p->vEdge1->nSize <= iObj)) goto LAB_001fbc45;
        iVar8 = p->vEdgeDelay->pArray[lVar15];
        if (p->vEdge1->pArray[uVar7] != uVar9) {
          if (p->vEdge2->nSize <= iObj) goto LAB_001fbc45;
          if (p->vEdge2->pArray[uVar7] != uVar9) {
            iVar8 = iVar8 + iVar13;
            if (DelayMax <= iVar8) {
              __assert_fail("Delay1 + Delay2 + 1 <= DelayMax",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                            ,0x32c,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
            }
            if (iVar8 + 1 == DelayMax) {
              iVar8 = (int)local_88;
              local_88 = (ulong)(iVar8 + 1);
              auStack_48[iVar8] = uVar9;
            }
            goto LAB_001fb6f0;
          }
        }
        uVar17 = uVar17 + 1;
        iVar8 = iVar8 + iVar13;
        if (DelayMax < iVar8) {
          __assert_fail("Delay1 + Delay2 <= DelayMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                        ,0x324,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
        }
        if (iVar8 == DelayMax) {
          local_80 = local_80 + 1;
        }
        else {
          local_74 = local_74 + 1;
        }
      }
LAB_001fb6f0:
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
  }
  if (p->vEdgeDelay->nSize <= iObj) goto LAB_001fbc45;
  if (p->vFanouts2->nSize <= iObj) goto LAB_001fbcff;
  pVVar4 = p->vFanouts2->pArray;
  uVar1 = pVVar4[uVar7].nSize;
  uVar9 = 0;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  if ((long)(int)uVar1 < 1) {
    local_7c = 0;
    local_70 = 0;
  }
  else {
    iVar13 = p->vEdgeDelay->pArray[uVar7];
    local_70 = 0;
    local_7c = 0;
    uVar9 = 0;
    uVar14 = 0;
    do {
      if ((long)(int)uVar1 <= (long)uVar14) goto LAB_001fbc45;
      uVar2 = pVVar4[uVar7].pArray[uVar14];
      lVar15 = (long)(int)uVar2;
      if ((lVar15 < 0) || (p->nObjs <= (int)uVar2)) {
LAB_001fbc64:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar16 = (uint)*(undefined8 *)(p->pObjs + lVar15);
      if (((int)uVar16 < 0) || ((uVar16 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iNext))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x338,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
      }
      if ((iVar10 <= (int)uVar2) || (p->vEdge1->nSize <= iObj)) goto LAB_001fbc45;
      iVar8 = piVar3[lVar15];
      if (p->vEdge1->pArray[uVar7] == uVar2) {
LAB_001fb7f4:
        uVar17 = uVar17 + 1;
        iVar8 = iVar8 + iVar13;
        if (DelayMax < iVar8) {
          __assert_fail("Delay1 + Delay2 <= DelayMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                        ,0x33d,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
        }
        if (iVar8 == DelayMax) {
          local_7c = local_7c + 1;
        }
        else {
          uVar9 = uVar9 + 1;
        }
      }
      else {
        if (p->vEdge2->nSize <= iObj) goto LAB_001fbc45;
        if (p->vEdge2->pArray[uVar7] == uVar2) goto LAB_001fb7f4;
        iVar8 = iVar8 + iVar13;
        if (DelayMax <= iVar8) {
          __assert_fail("Delay1 + Delay2 + 1 <= DelayMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                        ,0x345,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
        }
        if (iVar8 + 1 == DelayMax) {
          iVar8 = (int)local_70;
          if (iVar8 < nEdgeLimit) {
            auStack_58[iVar8] = uVar2;
          }
          local_70 = (ulong)(iVar8 + 1);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
  }
  if (fVerbose != 0) {
    printf("%8d : ",uVar7);
    printf("Edges = %d  ",(ulong)uVar17);
    if (p->vMapping2->nSize <= iObj) {
LAB_001fbcff:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    printf("Fanins (all %d  EC %d  ENC %d  C %d)  ",(ulong)(uint)p->vMapping2->pArray[uVar7].nSize,
           (ulong)local_80,(ulong)local_74,local_88);
    if (p->vFanouts2->nSize <= iObj) goto LAB_001fbcff;
    printf("Fanouts (all %d  EC %d  ENC %d  C %d)  ",(ulong)(uint)p->vFanouts2->pArray[uVar7].nSize,
           (ulong)local_7c,(ulong)uVar9,local_70);
  }
  if (nEdgeLimit < (int)uVar17) {
    __assert_fail("nEdges <= nEdgeLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x358,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
  }
  if (nEdgeLimit == uVar17) {
    if (fVerbose == 0) {
      return 0;
    }
    pcVar12 = "Full";
LAB_001fbc2f:
    iVar10 = 0;
    puts(pcVar12);
  }
  else {
    if (((local_80 == 0) && ((int)local_88 != 0)) && ((int)local_88 <= (int)(nEdgeLimit - uVar17)))
    {
      if ((int)local_88 < 1) {
        uVar11 = 0;
LAB_001fb9b7:
        if ((int)uVar11 != (int)local_88) goto LAB_001fbaa9;
      }
      else {
        uVar11 = 0;
        do {
          uVar1 = auStack_48[uVar11];
          lVar15 = (long)(int)uVar1;
          if (((lVar15 < 0) || (p->vEdge1->nSize <= (int)uVar1)) || (p->vEdge2->nSize <= (int)uVar1)
             ) goto LAB_001fbc45;
          if ((uint)(0 < p->vEdge2->pArray[lVar15]) + (uint)(0 < p->vEdge1->pArray[lVar15]) ==
              nEdgeLimit) goto LAB_001fb9b7;
          uVar11 = uVar11 + 1;
        } while (local_88 != uVar11);
      }
      if (0 < (int)local_88) {
        pVVar4 = p->vEdge1;
        pVVar5 = p->vEdge2;
        uVar11 = 0;
        iVar10 = 0;
        do {
          if (pVVar4->nSize <= iObj) goto LAB_001fbc45;
          uVar1 = auStack_48[uVar11];
          piVar6 = pVVar4->pArray;
          piVar3 = piVar6;
          if (piVar6[uVar7] == 0) {
LAB_001fba1b:
            piVar3[uVar7] = uVar1;
            iVar13 = 0;
          }
          else {
            if (pVVar5->nSize <= iObj) goto LAB_001fbc45;
            piVar3 = pVVar5->pArray;
            iVar13 = 1;
            if (piVar3[uVar7] == 0) goto LAB_001fba1b;
          }
          if (((int)uVar1 < 0) || (pVVar4->nSize <= (int)uVar1)) goto LAB_001fbc45;
          if (piVar6[uVar1] == 0) {
LAB_001fba60:
            piVar6[uVar1] = iObj;
            iVar8 = 0;
          }
          else {
            if (pVVar5->nSize <= (int)uVar1) goto LAB_001fbc45;
            piVar6 = pVVar5->pArray;
            iVar8 = 1;
            if (piVar6[uVar1] == 0) goto LAB_001fba60;
          }
          iVar10 = iVar10 + iVar13 + iVar8;
          uVar11 = uVar11 + 1;
        } while (local_88 != uVar11);
        if (iVar10 != 0) {
          puts("Wrong number of edges.");
        }
      }
      if (fVerbose == 0) {
        return 1;
      }
      pcVar12 = "Fixed %d critical fanins\n";
    }
    else {
LAB_001fbaa9:
      if (((local_7c != 0) || (iVar10 = (int)local_70, iVar10 == 0)) ||
         ((int)(nEdgeLimit - uVar17) < iVar10)) {
LAB_001fbc1f:
        if (fVerbose == 0) {
          return 0;
        }
        pcVar12 = "Cannot fix";
        goto LAB_001fbc2f;
      }
      if (iVar10 < 1) {
        uVar11 = 0;
LAB_001fbb32:
        if ((int)uVar11 != iVar10) goto LAB_001fbc1f;
      }
      else {
        uVar11 = 0;
        do {
          uVar1 = auStack_58[uVar11];
          lVar15 = (long)(int)uVar1;
          if (((lVar15 < 0) || (p->vEdge1->nSize <= (int)uVar1)) || (p->vEdge2->nSize <= (int)uVar1)
             ) goto LAB_001fbc45;
          if ((uint)(0 < p->vEdge2->pArray[lVar15]) + (uint)(0 < p->vEdge1->pArray[lVar15]) ==
              nEdgeLimit) goto LAB_001fbb32;
          uVar11 = uVar11 + 1;
        } while (local_70 != uVar11);
      }
      if (0 < iVar10) {
        pVVar4 = p->vEdge1;
        pVVar5 = p->vEdge2;
        uVar11 = 0;
        iVar10 = 0;
        do {
          if (pVVar4->nSize <= iObj) goto LAB_001fbc45;
          uVar1 = auStack_58[uVar11];
          piVar6 = pVVar4->pArray;
          piVar3 = piVar6;
          if (piVar6[uVar7] == 0) {
LAB_001fbb93:
            piVar3[uVar7] = uVar1;
            iVar13 = 0;
          }
          else {
            if (pVVar5->nSize <= iObj) goto LAB_001fbc45;
            piVar3 = pVVar5->pArray;
            iVar13 = 1;
            if (piVar3[uVar7] == 0) goto LAB_001fbb93;
          }
          if (((int)uVar1 < 0) || (pVVar4->nSize <= (int)uVar1)) goto LAB_001fbc45;
          if (piVar6[uVar1] == 0) {
LAB_001fbbd8:
            piVar6[uVar1] = iObj;
            iVar8 = 0;
          }
          else {
            if (pVVar5->nSize <= (int)uVar1) goto LAB_001fbc45;
            piVar6 = pVVar5->pArray;
            iVar8 = 1;
            if (piVar6[uVar1] == 0) goto LAB_001fbbd8;
          }
          iVar10 = iVar10 + iVar13 + iVar8;
          uVar11 = uVar11 + 1;
        } while (local_70 != uVar11);
        if (iVar10 != 0) {
          puts("Wrong number of edges.");
        }
      }
      if (fVerbose == 0) {
        return 1;
      }
      pcVar12 = "Fixed %d critical fanouts\n";
      local_88 = local_70;
    }
    iVar10 = 1;
    printf(pcVar12,local_88);
  }
  return iVar10;
}

Assistant:

int Edg_ObjImprove( Gia_Man_t * p, int iObj, int nEdgeLimit, int DelayMax, int fVerbose )
{
    int nFaninsC = 0,   nFanoutsC = 0;    // critical
    int nFaninsEC = 0,  nFanoutsEC = 0;   // edge-critical
    int nFaninsENC = 0, nFanoutsENC = 0;  // edge-non-critial
    int pFanins[4], pFanouts[4];
    int nEdgeDiff, nEdges = 0, Count = 0;
    int i, iNext, Delay1, Delay2;
    // count how many fanins have critical edge
    Delay1 = Vec_IntEntry( p->vEdgeDelayR, iObj );
    //if ( Delay1 > 1 )
    Gia_LutForEachFanin2( p, iObj, iNext, i )
    {
        if ( !Gia_ObjIsAnd(Gia_ManObj(p, iNext)) )
            continue;
        Delay2 = Vec_IntEntry( p->vEdgeDelay, iNext );
        if ( Gia_ObjHaveEdge(p, iObj, iNext) )
        {
            nEdges++;
            assert( Delay1 + Delay2 <= DelayMax );
            if ( Delay1 + Delay2 == DelayMax )
                nFaninsEC++;
            else
                nFaninsENC++;
        }
        else
        {
            assert( Delay1 + Delay2 + 1 <= DelayMax );
            if ( Delay1 + Delay2 + 1 == DelayMax )
                pFanins[nFaninsC++] = iNext;
        }
    }
    // count how many fanouts have critical edge
    Delay1 = Vec_IntEntry( p->vEdgeDelay, iObj );
    //if ( Delay2 < DelayMax - 1 )
    Gia_LutForEachFanout2( p, iObj, iNext, i )
    {
        //if ( !Gia_ObjIsAnd(Gia_ManObj(p, iNext)) )
        //    continue;
        assert( Gia_ObjIsAnd(Gia_ManObj(p, iNext)) );
        Delay2 = Vec_IntEntry( p->vEdgeDelayR, iNext );
        if ( Gia_ObjHaveEdge(p, iObj, iNext) )
        {
            nEdges++;
            assert( Delay1 + Delay2 <= DelayMax );
            if ( Delay1 + Delay2 == DelayMax )
                nFanoutsEC++;
            else
                nFanoutsENC++;
        }
        else
        {
            assert( Delay1 + Delay2 + 1 <= DelayMax );
            if ( Delay1 + Delay2 + 1 == DelayMax )
            {
                if ( nFanoutsC < nEdgeLimit )
                    pFanouts[nFanoutsC] = iNext;
                nFanoutsC++;
            }
        }
    }
    if ( fVerbose )
    {
        printf( "%8d : ", iObj );
        printf( "Edges = %d  ", nEdges );
        printf( "Fanins (all %d  EC %d  ENC %d  C %d)  ", 
            Gia_ObjLutSize2(p, iObj), nFaninsEC, nFaninsENC, nFaninsC );
        printf( "Fanouts (all %d  EC %d  ENC %d  C %d)  ", 
            Gia_ObjLutFanoutNum2(p, iObj), nFanoutsEC, nFanoutsENC, nFanoutsC );
    }
    // consider simple cases
    assert( nEdges <= nEdgeLimit );
    if ( nEdges == nEdgeLimit )
    {
        if ( fVerbose )
            printf( "Full\n" );
        return 0;
    }
    nEdgeDiff = nEdgeLimit - nEdges;
    // check if fanins or fanouts could be improved
    if ( nFaninsEC == 0 && nFaninsC && nFaninsC <= nEdgeDiff )
    {
        for ( i = 0; i < nFaninsC; i++ )
            if ( Gia_ObjEdgeCount(pFanins[i], p->vEdge1, p->vEdge2) == nEdgeLimit )
                break;
        if ( i == nFaninsC )
        {
            for ( i = 0; i < nFaninsC; i++ )
            {
                Count += Gia_ObjEdgeAdd( iObj, pFanins[i], p->vEdge1, p->vEdge2 );
                Count += Gia_ObjEdgeAdd( pFanins[i], iObj, p->vEdge1, p->vEdge2 );
            }
            if ( Count )
                printf( "Wrong number of edges.\n" );
            if ( fVerbose )
                printf( "Fixed %d critical fanins\n", nFaninsC );
            return 1;
        }
    }
    if ( nFanoutsEC == 0 && nFanoutsC && nFanoutsC <= nEdgeDiff )
    {
        for ( i = 0; i < nFanoutsC; i++ )
            if ( Gia_ObjEdgeCount(pFanouts[i], p->vEdge1, p->vEdge2) == nEdgeLimit )
                break;
        if ( i == nFanoutsC )
        {
            for ( i = 0; i < nFanoutsC; i++ )
            {
                Count += Gia_ObjEdgeAdd( iObj, pFanouts[i], p->vEdge1, p->vEdge2 );
                Count += Gia_ObjEdgeAdd( pFanouts[i], iObj, p->vEdge1, p->vEdge2 );
            }
            if ( Count )
                printf( "Wrong number of edges.\n" );
            if ( fVerbose )
                printf( "Fixed %d critical fanouts\n", nFanoutsC );
            return 1;
        }
    }
    if ( fVerbose )
        printf( "Cannot fix\n" );
    return 0;
}